

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

compare_eq_result_container<QList<QByteArray>,_QByteArray> __thiscall
QList<QByteArray>::operator==(QList<QByteArray> *this,QList<QByteArray> *other)

{
  long lVar1;
  bool bVar2;
  QByteArray *lhs;
  QByteArray *rhs;
  long lVar3;
  
  lVar3 = (this->d).size;
  lVar1 = (other->d).size;
  if (lVar3 == lVar1) {
    lhs = (this->d).ptr;
    rhs = (other->d).ptr;
    if (lhs == rhs) {
      return true;
    }
    if (lVar3 == lVar1) {
      if (lVar3 == 0) {
        return lVar3 == 0;
      }
      bVar2 = ::operator==(lhs,rhs);
      if (bVar2) {
        lVar3 = lVar3 * 0x18;
        do {
          lVar3 = lVar3 + -0x18;
          rhs = rhs + 1;
          lhs = lhs + 1;
          if (lVar3 == 0) {
            return lVar3 == 0;
          }
          bVar2 = ::operator==(lhs,rhs);
        } while (bVar2);
        return false;
      }
    }
  }
  return false;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }